

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<4,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  uint uVar8;
  Geometry *this;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar24;
  bool bVar25;
  byte bVar26;
  bool bVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  byte bVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar44;
  StackItemT<embree::NodeRefPtr<4>_> SVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar51;
  undefined1 auVar52 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar53;
  StackItemT<embree::NodeRefPtr<4>_> SVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vfloat<4> tNear;
  undefined1 local_1048 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar41 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  }
  pSVar31 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar64._4_4_ = fVar1;
  auVar64._0_4_ = fVar1;
  auVar64._8_4_ = fVar1;
  auVar64._12_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar65._4_4_ = fVar2;
  auVar65._0_4_ = fVar2;
  auVar65._8_4_ = fVar2;
  auVar65._12_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar66._4_4_ = fVar3;
  auVar66._0_4_ = fVar3;
  auVar66._8_4_ = fVar3;
  auVar66._12_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar55._4_4_ = uVar4;
  auVar55._0_4_ = uVar4;
  auVar55._8_4_ = uVar4;
  auVar55._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar58._4_4_ = uVar4;
  auVar58._0_4_ = uVar4;
  auVar58._8_4_ = uVar4;
  auVar58._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar42._4_4_ = uVar4;
  auVar42._0_4_ = uVar4;
  auVar42._8_4_ = uVar4;
  auVar42._12_4_ = uVar4;
  bVar27 = false;
  do {
    auVar14 = vsubps_avx(auVar64,auVar55);
    fVar10 = auVar55._0_4_;
    fVar11 = auVar55._4_4_;
    fVar12 = auVar55._8_4_;
    fVar13 = auVar55._12_4_;
    auVar55 = vsubps_avx(auVar65,auVar58);
    auVar15 = vsubps_avx(auVar66,auVar42);
    auVar59._0_4_ = fVar3 + auVar42._0_4_;
    auVar59._4_4_ = fVar3 + auVar42._4_4_;
    auVar59._8_4_ = fVar3 + auVar42._8_4_;
    auVar59._12_4_ = fVar3 + auVar42._12_4_;
    auVar67._0_4_ = fVar10 * fVar10;
    auVar67._4_4_ = fVar11 * fVar11;
    auVar67._8_4_ = fVar12 * fVar12;
    auVar67._12_4_ = fVar13 * fVar13;
LAB_01bd6f3e:
    do {
      do {
        if (pSVar31 == stack) {
          return bVar27;
        }
        pSVar24 = pSVar31 + -1;
        pSVar31 = pSVar31 + -1;
      } while ((float)local_1048._0_4_ < (float)pSVar24->dist);
      uVar37 = (pSVar31->ptr).ptr;
LAB_01bd6f5c:
      uVar29 = (uint)uVar37;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar37 & 8) != 0) goto LAB_01bd739a;
        uVar34 = uVar37 & 0xfffffffffffffff0;
        fVar5 = query->time;
        auVar57._4_4_ = fVar5;
        auVar57._0_4_ = fVar5;
        auVar57._8_4_ = fVar5;
        auVar57._12_4_ = fVar5;
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x80),auVar57,
                                  *(undefined1 (*) [16])(uVar34 + 0x20));
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xa0),auVar57,
                                  *(undefined1 (*) [16])(uVar34 + 0x40));
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xc0),auVar57,
                                  *(undefined1 (*) [16])(uVar34 + 0x60));
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x90),auVar57,
                                  *(undefined1 (*) [16])(uVar34 + 0x30));
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xb0),auVar57,
                                  *(undefined1 (*) [16])(uVar34 + 0x50));
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xd0),auVar57,
                                  *(undefined1 (*) [16])(uVar34 + 0x70));
        auVar42 = vmaxps_avx(auVar64,auVar38);
        auVar42 = vminps_avx(auVar42,auVar49);
        auVar40 = vsubps_avx(auVar42,auVar64);
        auVar42 = vmaxps_avx(auVar65,auVar60);
        auVar42 = vminps_avx(auVar42,auVar46);
        auVar23 = vsubps_avx(auVar42,auVar65);
        auVar42 = vmaxps_avx(auVar66,auVar61);
        auVar42 = vminps_avx(auVar42,auVar56);
        auVar42 = vsubps_avx(auVar42,auVar66);
        tNear.field_0.v[1] =
             auVar42._4_4_ * auVar42._4_4_ +
             auVar23._4_4_ * auVar23._4_4_ + auVar40._4_4_ * auVar40._4_4_;
        tNear.field_0.v[0] =
             auVar42._0_4_ * auVar42._0_4_ +
             auVar23._0_4_ * auVar23._0_4_ + auVar40._0_4_ * auVar40._0_4_;
        tNear.field_0.v[2] =
             auVar42._8_4_ * auVar42._8_4_ +
             auVar23._8_4_ * auVar23._8_4_ + auVar40._8_4_ * auVar40._8_4_;
        tNear.field_0.v[3] =
             auVar42._12_4_ * auVar42._12_4_ +
             auVar23._12_4_ * auVar23._12_4_ + auVar40._12_4_ * auVar40._12_4_;
        uVar21 = vcmpps_avx512vl(auVar38,auVar49,2);
        uVar22 = vcmpps_avx512vl(auVar49,auVar14,1);
        auVar23._4_4_ = fVar1 + fVar11;
        auVar23._0_4_ = fVar1 + fVar10;
        auVar23._8_4_ = fVar1 + fVar12;
        auVar23._12_4_ = fVar1 + fVar13;
        uVar16 = vcmpps_avx512vl(auVar38,auVar23,6);
        uVar17 = vcmpps_avx512vl(auVar46,auVar55,1);
        auVar40._4_4_ = fVar2 + auVar58._4_4_;
        auVar40._0_4_ = fVar2 + auVar58._0_4_;
        auVar40._8_4_ = fVar2 + auVar58._8_4_;
        auVar40._12_4_ = fVar2 + auVar58._12_4_;
        uVar18 = vcmpps_avx512vl(auVar60,auVar40,6);
        uVar19 = vcmpps_avx512vl(auVar56,auVar15,1);
        uVar20 = vcmpps_avx512vl(auVar61,auVar59,6);
        bVar26 = ~((byte)uVar18 | (byte)uVar16 | (byte)uVar20 | (byte)uVar22 | (byte)uVar17 |
                  (byte)uVar19) & (byte)uVar21;
        uVar36 = (ulong)bVar26;
        if ((uVar29 & 7) == 6) {
          uVar21 = vcmpps_avx512vl(auVar57,*(undefined1 (*) [16])(uVar34 + 0xf0),1);
          uVar22 = vcmpps_avx512vl(auVar57,*(undefined1 (*) [16])(uVar34 + 0xe0),0xd);
          uVar36 = (ulong)(bVar26 & (byte)uVar21 & (byte)uVar22);
        }
LAB_01bd7033:
        if ((char)uVar36 != '\0') {
          uVar34 = uVar37 & 0xfffffffffffffff0;
          lVar30 = 0;
          for (uVar37 = uVar36; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar30 = lVar30 + 1;
          }
          uVar37 = *(ulong *)(uVar34 + lVar30 * 8);
          uVar29 = (uint)uVar36 - 1 & (uint)uVar36;
          uVar36 = (ulong)uVar29;
          if (uVar29 != 0) {
            uVar7 = *(uint *)(local_1048 + lVar30 * 4 + -0x10);
            lVar30 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar30 = lVar30 + 1;
            }
            uVar29 = uVar29 - 1 & uVar29;
            uVar28 = (ulong)uVar29;
            uVar36 = *(ulong *)(uVar34 + lVar30 * 8);
            uVar8 = *(uint *)(local_1048 + lVar30 * 4 + -0x10);
            if (uVar29 == 0) {
              if (uVar7 < uVar8) {
                (pSVar31->ptr).ptr = uVar36;
                pSVar31->dist = uVar8;
                pSVar31 = pSVar31 + 1;
              }
              else {
                (pSVar31->ptr).ptr = uVar37;
                pSVar31->dist = uVar7;
                pSVar31 = pSVar31 + 1;
                uVar37 = uVar36;
              }
            }
            else {
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar37;
              auVar42 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar7));
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar36;
              auVar40 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar8));
              lVar30 = 0;
              for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                lVar30 = lVar30 + 1;
              }
              uVar29 = uVar29 - 1 & uVar29;
              uVar37 = (ulong)uVar29;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = *(ulong *)(uVar34 + lVar30 * 8);
              auVar61 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_1048 + lVar30 * 4 + -0x10)))
              ;
              auVar23 = vpshufd_avx(auVar42,0xaa);
              auVar38 = vpshufd_avx(auVar40,0xaa);
              auVar60 = vpshufd_avx(auVar61,0xaa);
              if (uVar29 == 0) {
                uVar37 = vpcmpgtd_avx512vl(auVar38,auVar23);
                uVar37 = uVar37 & 0xf;
                auVar38 = vpblendmd_avx512vl(auVar40,auVar42);
                bVar25 = (bool)((byte)uVar37 & 1);
                auVar39._0_4_ = (uint)bVar25 * auVar38._0_4_ | (uint)!bVar25 * auVar23._0_4_;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar39._4_4_ = (uint)bVar25 * auVar38._4_4_ | (uint)!bVar25 * auVar23._4_4_;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar39._8_4_ = (uint)bVar25 * auVar38._8_4_ | (uint)!bVar25 * auVar23._8_4_;
                bVar25 = SUB81(uVar37 >> 3,0);
                auVar39._12_4_ = (uint)bVar25 * auVar38._12_4_ | (uint)!bVar25 * auVar23._12_4_;
                auVar40 = vmovdqa32_avx512vl(auVar40);
                bVar25 = (bool)((byte)uVar37 & 1);
                auVar41._0_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar41._4_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * auVar42._4_4_;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar41._8_4_ = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * auVar42._8_4_;
                bVar25 = SUB81(uVar37 >> 3,0);
                auVar41._12_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * auVar42._12_4_;
                auVar42 = vpshufd_avx(auVar39,0xaa);
                uVar36 = vpcmpgtd_avx512vl(auVar60,auVar42);
                uVar36 = uVar36 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar61,auVar39);
                bVar25 = (bool)((byte)uVar36 & 1);
                bVar9 = (bool)((byte)(uVar36 >> 1) & 1);
                uVar37 = CONCAT44((uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar42._4_4_,
                                  (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_);
                auVar42 = vmovdqa32_avx512vl(auVar61);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar43._0_4_ = (uint)bVar25 * auVar42._0_4_ | !bVar25 * auVar39._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar25 * auVar42._4_4_ | !bVar25 * auVar39._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar25 * auVar42._8_4_ | !bVar25 * auVar39._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar43._12_4_ = (uint)bVar25 * auVar42._12_4_ | !bVar25 * auVar39._12_4_;
                auVar42 = vpshufd_avx(auVar43,0xaa);
                auVar40 = vpshufd_avx(auVar41,0xaa);
                uVar36 = vpcmpgtd_avx512vl(auVar42,auVar40);
                uVar36 = uVar36 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar43,auVar41);
                bVar25 = (bool)((byte)uVar36 & 1);
                SVar44.ptr.ptr._0_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                SVar44.ptr.ptr._4_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * auVar42._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                SVar44.dist = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * auVar42._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                SVar44._12_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * auVar42._12_4_;
                auVar42 = vmovdqa32_avx512vl(auVar43);
                bVar25 = (bool)((byte)uVar36 & 1);
                SVar45.ptr.ptr._0_4_ = (uint)bVar25 * auVar42._0_4_ | !bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                SVar45.ptr.ptr._4_4_ = (uint)bVar25 * auVar42._4_4_ | !bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                SVar45.dist = (uint)bVar25 * auVar42._8_4_ | !bVar25 * auVar41._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                SVar45._12_4_ = (uint)bVar25 * auVar42._12_4_ | !bVar25 * auVar41._12_4_;
                *pSVar31 = SVar45;
                pSVar31[1] = SVar44;
                pSVar31 = pSVar31 + 2;
              }
              else {
                lVar30 = 0;
                for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                  lVar30 = lVar30 + 1;
                }
                uVar29 = *(uint *)(local_1048 + lVar30 * 4 + -0x10);
                auVar63._8_8_ = 0;
                auVar63._0_8_ = *(ulong *)(uVar34 + lVar30 * 8);
                auVar49 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar29));
                uVar37 = vpcmpgtd_avx512vl(auVar38,auVar23);
                uVar37 = uVar37 & 0xf;
                auVar38 = vpblendmd_avx512vl(auVar40,auVar42);
                bVar25 = (bool)((byte)uVar37 & 1);
                auVar46._0_4_ = (uint)bVar25 * auVar38._0_4_ | (uint)!bVar25 * auVar23._0_4_;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar25 * auVar38._4_4_ | (uint)!bVar25 * auVar23._4_4_;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar25 * auVar38._8_4_ | (uint)!bVar25 * auVar23._8_4_;
                bVar25 = SUB81(uVar37 >> 3,0);
                auVar46._12_4_ = (uint)bVar25 * auVar38._12_4_ | (uint)!bVar25 * auVar23._12_4_;
                auVar40 = vmovdqa32_avx512vl(auVar40);
                bVar25 = (bool)((byte)uVar37 & 1);
                auVar47._0_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * auVar42._4_4_;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * auVar42._8_4_;
                bVar25 = SUB81(uVar37 >> 3,0);
                auVar47._12_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * auVar42._12_4_;
                auVar62._4_4_ = uVar29;
                auVar62._0_4_ = uVar29;
                auVar62._8_4_ = uVar29;
                auVar62._12_4_ = uVar29;
                uVar37 = vpcmpgtd_avx512vl(auVar62,auVar60);
                uVar37 = uVar37 & 0xf;
                auVar42 = vpblendmd_avx512vl(auVar49,auVar61);
                bVar25 = (bool)((byte)uVar37 & 1);
                auVar48._0_4_ = (uint)bVar25 * auVar42._0_4_ | !bVar25 * uVar29;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar25 * auVar42._4_4_ | !bVar25 * uVar29;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar25 * auVar42._8_4_ | !bVar25 * uVar29;
                bVar25 = SUB81(uVar37 >> 3,0);
                auVar48._12_4_ = (uint)bVar25 * auVar42._12_4_ | !bVar25 * uVar29;
                auVar42 = vmovdqa32_avx512vl(auVar49);
                bVar25 = (bool)((byte)uVar37 & 1);
                auVar49._0_4_ = (uint)bVar25 * auVar42._0_4_ | (uint)!bVar25 * auVar61._0_4_;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar49._4_4_ = (uint)bVar25 * auVar42._4_4_ | (uint)!bVar25 * auVar61._4_4_;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar49._8_4_ = (uint)bVar25 * auVar42._8_4_ | (uint)!bVar25 * auVar61._8_4_;
                bVar25 = SUB81(uVar37 >> 3,0);
                auVar49._12_4_ = (uint)bVar25 * auVar42._12_4_ | (uint)!bVar25 * auVar61._12_4_;
                auVar42 = vpshufd_avx(auVar49,0xaa);
                auVar40 = vpshufd_avx(auVar47,0xaa);
                uVar37 = vpcmpgtd_avx512vl(auVar42,auVar40);
                uVar37 = uVar37 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar49,auVar47);
                bVar25 = (bool)((byte)uVar37 & 1);
                auVar50._0_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar50._4_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * auVar42._4_4_;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar50._8_4_ = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * auVar42._8_4_;
                bVar25 = SUB81(uVar37 >> 3,0);
                auVar50._12_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * auVar42._12_4_;
                auVar42 = vmovdqa32_avx512vl(auVar49);
                bVar25 = (bool)((byte)uVar37 & 1);
                SVar51.ptr.ptr._0_4_ = (uint)bVar25 * auVar42._0_4_ | !bVar25 * auVar47._0_4_;
                bVar25 = (bool)((byte)(uVar37 >> 1) & 1);
                SVar51.ptr.ptr._4_4_ = (uint)bVar25 * auVar42._4_4_ | !bVar25 * auVar47._4_4_;
                bVar25 = (bool)((byte)(uVar37 >> 2) & 1);
                SVar51.dist = (uint)bVar25 * auVar42._8_4_ | !bVar25 * auVar47._8_4_;
                bVar25 = SUB81(uVar37 >> 3,0);
                SVar51._12_4_ = (uint)bVar25 * auVar42._12_4_ | !bVar25 * auVar47._12_4_;
                auVar42 = vpshufd_avx(auVar48,0xaa);
                auVar40 = vpshufd_avx(auVar46,0xaa);
                uVar36 = vpcmpgtd_avx512vl(auVar42,auVar40);
                uVar36 = uVar36 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar48,auVar46);
                bVar25 = (bool)((byte)uVar36 & 1);
                bVar9 = (bool)((byte)(uVar36 >> 1) & 1);
                uVar37 = CONCAT44((uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar42._4_4_,
                                  (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_);
                auVar42 = vmovdqa32_avx512vl(auVar48);
                bVar25 = (bool)((byte)uVar36 & 1);
                auVar52._0_4_ = (uint)bVar25 * auVar42._0_4_ | !bVar25 * auVar46._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar52._4_4_ = (uint)bVar25 * auVar42._4_4_ | !bVar25 * auVar46._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar52._8_4_ = (uint)bVar25 * auVar42._8_4_ | !bVar25 * auVar46._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                auVar52._12_4_ = (uint)bVar25 * auVar42._12_4_ | !bVar25 * auVar46._12_4_;
                auVar42 = vpshufd_avx(auVar52,0xaa);
                auVar40 = vpshufd_avx(auVar50,0xaa);
                uVar36 = vpcmpgtd_avx512vl(auVar40,auVar42);
                uVar36 = uVar36 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar50,auVar52);
                bVar25 = (bool)((byte)uVar36 & 1);
                SVar53.ptr.ptr._0_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                SVar53.ptr.ptr._4_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * auVar42._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                SVar53.dist = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * auVar42._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                SVar53._12_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * auVar42._12_4_;
                auVar42 = vmovdqa32_avx512vl(auVar50);
                bVar25 = (bool)((byte)uVar36 & 1);
                SVar54.ptr.ptr._0_4_ = (uint)bVar25 * auVar42._0_4_ | !bVar25 * auVar52._0_4_;
                bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
                SVar54.ptr.ptr._4_4_ = (uint)bVar25 * auVar42._4_4_ | !bVar25 * auVar52._4_4_;
                bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
                SVar54.dist = (uint)bVar25 * auVar42._8_4_ | !bVar25 * auVar52._8_4_;
                bVar25 = SUB81(uVar36 >> 3,0);
                SVar54._12_4_ = (uint)bVar25 * auVar42._12_4_ | !bVar25 * auVar52._12_4_;
                *pSVar31 = SVar51;
                pSVar31[1] = SVar54;
                pSVar31[2] = SVar53;
                pSVar31 = pSVar31 + 3;
              }
            }
          }
          goto LAB_01bd6f5c;
        }
        goto LAB_01bd6f3e;
      }
      if ((uVar37 & 8) == 0) {
        uVar28 = uVar37 & 0xfffffffffffffff0;
        fVar5 = query->time;
        auVar56._4_4_ = fVar5;
        auVar56._0_4_ = fVar5;
        auVar56._8_4_ = fVar5;
        auVar56._12_4_ = fVar5;
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80),auVar56,
                                  *(undefined1 (*) [16])(uVar28 + 0x20));
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0xa0),auVar56,
                                  *(undefined1 (*) [16])(uVar28 + 0x40));
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0xc0),auVar56,
                                  *(undefined1 (*) [16])(uVar28 + 0x60));
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x90),auVar56,
                                  *(undefined1 (*) [16])(uVar28 + 0x30));
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0xb0),auVar56,
                                  *(undefined1 (*) [16])(uVar28 + 0x50));
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0xd0),auVar56,
                                  *(undefined1 (*) [16])(uVar28 + 0x70));
        auVar42 = vmaxps_avx(auVar64,auVar38);
        auVar42 = vminps_avx(auVar42,auVar61);
        auVar40 = vsubps_avx(auVar42,auVar64);
        auVar42 = vmaxps_avx(auVar65,auVar23);
        auVar42 = vminps_avx(auVar42,auVar49);
        auVar23 = vsubps_avx(auVar42,auVar65);
        auVar42 = vmaxps_avx(auVar66,auVar60);
        auVar42 = vminps_avx(auVar42,auVar46);
        auVar42 = vsubps_avx(auVar42,auVar66);
        tNear.field_0.v[0] =
             auVar40._0_4_ * auVar40._0_4_ + auVar23._0_4_ * auVar23._0_4_ +
             auVar42._0_4_ * auVar42._0_4_;
        tNear.field_0.v[1] =
             auVar40._4_4_ * auVar40._4_4_ + auVar23._4_4_ * auVar23._4_4_ +
             auVar42._4_4_ * auVar42._4_4_;
        tNear.field_0.v[2] =
             auVar40._8_4_ * auVar40._8_4_ + auVar23._8_4_ * auVar23._8_4_ +
             auVar42._8_4_ * auVar42._8_4_;
        tNear.field_0.v[3] =
             auVar40._12_4_ * auVar40._12_4_ + auVar23._12_4_ * auVar23._12_4_ +
             auVar42._12_4_ * auVar42._12_4_;
        uVar36 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar67,2);
        uVar34 = vcmpps_avx512vl(auVar38,auVar61,2);
        uVar36 = uVar36 & uVar34;
        if ((uVar29 & 7) == 6) {
          uVar21 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [16])(uVar28 + 0xf0),1);
          uVar22 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [16])(uVar28 + 0xe0),0xd);
          uVar36 = (ulong)(byte)((byte)uVar21 & (byte)uVar22 & (byte)uVar36);
        }
        goto LAB_01bd7033;
      }
LAB_01bd739a:
      lVar35 = (uVar37 & 0xfffffffffffffff0) + 0x130;
      bVar26 = 0;
      for (lVar30 = 0; lVar30 != (ulong)(uVar29 & 0xf) - 8; lVar30 = lVar30 + 1) {
        bVar32 = 0;
        for (lVar33 = -0x10; lVar33 != 0; lVar33 = lVar33 + 4) {
          uVar7 = *(uint *)(lVar35 + lVar33);
          if ((ulong)uVar7 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar7].ptr;
          context->geomID = uVar7;
          context->primID = *(uint *)(lVar35 + 0x10 + lVar33);
          bVar25 = Geometry::pointQuery(this,query,context);
          bVar32 = bVar32 | bVar25;
        }
        bVar26 = bVar26 | bVar32;
        lVar35 = lVar35 + 0x140;
      }
    } while (bVar26 == 0);
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar55._4_4_ = uVar4;
    auVar55._0_4_ = uVar4;
    auVar55._8_4_ = uVar4;
    auVar55._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar58._4_4_ = uVar4;
    auVar58._0_4_ = uVar4;
    auVar58._8_4_ = uVar4;
    auVar58._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar42._4_4_ = uVar4;
    auVar42._0_4_ = uVar4;
    auVar42._8_4_ = uVar4;
    auVar42._12_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    }
    bVar27 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }